

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_SimRsbResubVerify(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins)

{
  uint uVar1;
  word *pIn1;
  word *pIn2;
  
  pIn1 = Gia_SimRsbFunc(p,iObj,p->vFanins,0);
  pIn2 = Gia_SimRsbFunc(p,iObj,p->vFanins,1);
  uVar1 = Abc_TtIntersect(pIn1,pIn2,p->nWords,0);
  free(pIn1);
  free(pIn2);
  return uVar1 ^ 1;
}

Assistant:

int Gia_SimRsbResubVerify( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins )
{
    word * pTruth0 = Gia_SimRsbFunc( p, iObj, p->vFanins, 0 );
    word * pTruth1 = Gia_SimRsbFunc( p, iObj, p->vFanins, 1 );
    int Res = !Abc_TtIntersect( pTruth0, pTruth1, p->nWords, 0 );
    ABC_FREE( pTruth0 );
    ABC_FREE( pTruth1 );
    return Res;
}